

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O2

void __thiscall
libtorrent::i2p_stream::
send_accept<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (i2p_stream *this,
          _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *h)

{
  uint uVar1;
  uint uVar2;
  char cmd [400];
  mutable_buffer local_1d8;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:414:4),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
  local_1c8;
  char local_1a8 [400];
  
  this->m_state = read_accept_response;
  uVar2 = snprintf(local_1a8,400,"STREAM ACCEPT ID=%s\n",this->m_id);
  uVar1 = 400;
  if (uVar2 < 400) {
    uVar1 = uVar2;
  }
  local_1d8.size_ = (size_t)uVar1;
  local_1c8.m_underlying_handler._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>)
       (h->_M_bound_args).
       super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
       super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl;
  local_1c8.m_underlying_handler._M_f = h->_M_f;
  local_1c8.m_underlying_handler._8_8_ = *(undefined8 *)&h->field_0x8;
  local_1d8.data_ = local_1a8;
  local_1c8.m_handler.this = this;
  boost::asio::
  async_write<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,boost::asio::mutable_buffer,libtorrent::aux::wrap_allocator_t<libtorrent::i2p_stream::send_accept<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>(std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,unsigned_long,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)_1_,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>>
            ((noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
              *)this,&local_1d8,&local_1c8,(type *)0x0);
  return;
}

Assistant:

void send_accept(Handler h)
	{
		TORRENT_ASSERT(m_magic == 0x1337);
		m_state = read_accept_response;
		char cmd[400];
		int size = std::snprintf(cmd, sizeof(cmd), "STREAM ACCEPT ID=%s\n", m_id);
		ADD_OUTSTANDING_ASYNC("i2p_stream::start_read_line");
		async_write(m_sock, boost::asio::buffer(cmd, std::size_t(size)), aux::wrap_allocator(
			[this](error_code const& ec, std::size_t, Handler hn) {
				start_read_line(ec, std::move(hn));
			}, std::move(h)));
	}